

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_13fed1::BuildFileImpl::parseTargetsMapping(BuildFileImpl *this,MappingNode *map)

{
  pointer *pppNVar1;
  KeyValueNode *this_00;
  iterator __position;
  long lVar2;
  Target *pTVar3;
  StringRef Key;
  StringRef name_00;
  Target *pTVar4;
  Node *pNVar5;
  SequenceNode *C;
  size_t sVar6;
  char *pcVar7;
  ScalarNode *scalar;
  ScalarNode *extraout_RDX;
  ScalarNode *scalar_00;
  ScalarNode *extraout_RDX_00;
  pointer *__ptr;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_bool>
  pVar8;
  StringRef message;
  StringRef message_00;
  type target;
  iterator __begin2;
  iterator __begin3;
  string name;
  Target *local_98;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_90;
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> local_88;
  target_set *local_80;
  Node *local_78;
  string local_70;
  string local_50;
  
  local_90.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_90.Base != (MappingNode *)0x0) {
    local_80 = &this->targets;
    do {
      this_00 = (local_90.Base)->CurrentEntry;
      if (this_00 == (KeyValueNode *)0x0) {
        pcVar7 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_00139b4f:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar7);
      }
      pNVar5 = llvm::yaml::KeyValueNode::getKey(this_00);
      if (pNVar5->TypeID == 1) {
        pNVar5 = llvm::yaml::KeyValueNode::getValue(this_00);
        if (pNVar5->TypeID != 5) {
          pNVar5 = llvm::yaml::KeyValueNode::getValue(this_00);
          sVar6 = 0x23;
          pcVar7 = "invalid value type in \'targets\' map";
          goto LAB_00139a7f;
        }
        pNVar5 = llvm::yaml::KeyValueNode::getKey(this_00);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  (&local_70,pNVar5,scalar);
        C = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(this_00);
        llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
                  ((llvm *)&local_98,&local_70);
        local_88.Base = (SequenceNode *)llvm::yaml::begin<llvm::yaml::SequenceNode>(C);
        scalar_00 = extraout_RDX;
        while (pTVar3 = local_98, local_88.Base != (SequenceNode *)0x0) {
          pNVar5 = (local_88.Base)->CurrentEntry;
          if (pNVar5 == (Node *)0x0) {
            pcVar7 = 
            "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
            ;
            goto LAB_00139b4f;
          }
          if (pNVar5->TypeID == 1) {
            (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                      (&local_50,pNVar5,scalar_00);
            name_00.Length = local_50._M_string_length;
            name_00.Data = local_50._M_dataplus._M_p;
            local_78 = getOrCreateNode(this,name_00,true);
            __position._M_current =
                 (pTVar3->nodes).
                 super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pTVar3->nodes).
                super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>::
              _M_realloc_insert<llbuild::buildsystem::Node*>
                        ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                          *)&pTVar3->nodes,__position,&local_78);
            }
            else {
              *__position._M_current = local_78;
              pppNVar1 = &(pTVar3->nodes).
                          super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            message.Length = 0x22;
            message.Data = "invalid node type in \'targets\' map";
            error(this,pNVar5,message);
          }
          llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
          operator++(&local_88);
          scalar_00 = extraout_RDX_00;
        }
        (*this->delegate->_vptr_BuildFileDelegate[9])
                  (this->delegate,local_70._M_dataplus._M_p,local_70._M_string_length,local_98);
        Key.Length = local_70._M_string_length;
        Key.Data = local_70._M_dataplus._M_p;
        pVar8 = llvm::
                StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                ::try_emplace<>(local_80,Key);
        pTVar4 = local_98;
        lVar2 = *(long *)pVar8.first.
                         super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                         .Ptr.
                         super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
        ;
        local_98 = (Target *)0x0;
        pTVar3 = *(Target **)(lVar2 + 8);
        *(Target **)(lVar2 + 8) = pTVar4;
        if (pTVar3 != (Target *)0x0) {
          std::default_delete<llbuild::buildsystem::Target>::operator()
                    ((default_delete<llbuild::buildsystem::Target> *)(lVar2 + 8),pTVar3);
        }
        if (local_98 != (Target *)0x0) {
          std::default_delete<llbuild::buildsystem::Target>::operator()
                    ((default_delete<llbuild::buildsystem::Target> *)&local_98,local_98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pNVar5 = llvm::yaml::KeyValueNode::getKey(this_00);
        sVar6 = 0x21;
        pcVar7 = "invalid key type in \'targets\' map";
LAB_00139a7f:
        message_00.Length = sVar6;
        message_00.Data = pcVar7;
        error(this,pNVar5,message_00);
      }
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_90);
    } while (local_90.Base != (MappingNode *)0x0);
    local_90.Base = (MappingNode *)0x0;
  }
  return SUB81(local_90.Base,0);
}

Assistant:

bool parseTargetsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'targets' map");
        continue;
      }
      // Every value must be a sequence.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Sequence) {
        error(entry.getValue(), "invalid value type in 'targets' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::SequenceNode* nodes = static_cast<llvm::yaml::SequenceNode*>(
          entry.getValue());

      // Create the target.
      auto target = llvm::make_unique<Target>(name);

      // Add all of the nodes.
      for (auto& node: *nodes) {
        // All items must be scalar.
        if (node.getType() != llvm::yaml::Node::NK_Scalar) {
          error(&node, "invalid node type in 'targets' map");
          continue;
        }

        target->getNodes().push_back(
            getOrCreateNode(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)),
                /*isImplicit=*/true));
      }

      // Let the delegate know we loaded a target.
      delegate.loadedTarget(name, *target);

      // Add the target to the targets map.
      targets[name] = std::move(target);
    }

    return true;
  }